

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mcu8str_copy(mcu8str *str)

{
  mcu8str *in_RSI;
  mcu8str *in_RDI;
  mcu8str *unaff_retaddr;
  
  if (in_RSI->size == 0) {
    mcu8str_create_empty();
  }
  else {
    mcu8str_create((mcu8str_size_t)unaff_retaddr);
    mcu8str_assign(unaff_retaddr,in_RSI);
  }
  return in_RDI;
}

Assistant:

mcu8str mcu8str_copy( const mcu8str* str )
  {
    if ( str->size == 0 )
      return mcu8str_create_empty();
    mcu8str newstr = mcu8str_create( str->size );
    mcu8str_assign( &newstr, str );
    return newstr;
  }